

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

TiXmlNode * __thiscall despot::util::tinyxml::TiXmlComment::Clone(TiXmlComment *this)

{
  TiXmlNode *target;
  
  target = (TiXmlNode *)operator_new(0x50);
  TiXmlComment((TiXmlComment *)target);
  TiXmlNode::CopyTo(&this->super_TiXmlNode,target);
  return target;
}

Assistant:

TiXmlNode* TiXmlComment::Clone() const {
	TiXmlComment* clone = new TiXmlComment();

	if (!clone)
		return 0;

	CopyTo(clone);
	return clone;
}